

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::checkDepthStencilFormatSupport
               (Context *context,deUint32 format)

{
  bool bVar1;
  RenderContext *pRVar2;
  ContextInfo *this;
  NotSupportedError *this_00;
  Enum<int,_2UL> EVar3;
  byte local_c2;
  GetNameFunc local_a0;
  int local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  deUint32 local_2c;
  ContextType local_28;
  ApiType local_24;
  char *local_20;
  char *reqExt;
  Context *pCStack_10;
  deUint32 format_local;
  Context *context_local;
  
  if (format == 0x8d48) {
    local_20 = "GL_OES_texture_stencil8";
    reqExt._4_4_ = format;
    pCStack_10 = context;
    pRVar2 = Context::getRenderContext(context);
    local_28.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
    local_24 = glu::ContextType::getAPI(&local_28);
    local_2c = (deUint32)glu::ApiType::core(3,2);
    bVar1 = glu::ApiType::operator!=(&local_24,(ApiType)local_2c);
    local_c2 = 0;
    if (bVar1) {
      this = Context::getContextInfo(pCStack_10);
      bVar1 = glu::ContextInfo::isExtensionSupported(this,local_20);
      local_c2 = bVar1 ^ 0xff;
    }
    if ((local_c2 & 1) != 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      EVar3 = glu::getTextureFormatStr(reqExt._4_4_);
      local_a0 = EVar3.m_getName;
      local_98 = EVar3.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_a0);
      std::operator+(&local_70,&local_90," requires ");
      std::operator+(&local_50,&local_70,local_20);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_50);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return;
}

Assistant:

static void checkDepthStencilFormatSupport (Context& context, deUint32 format)
{
	if (format == GL_STENCIL_INDEX8)
	{
		const char* reqExt = "GL_OES_texture_stencil8";
		if ((context.getRenderContext().getType().getAPI() != glu::ApiType::core(3,2)) && !context.getContextInfo().isExtensionSupported(reqExt))
			throw tcu::NotSupportedError(glu::getTextureFormatStr(format).toString() + " requires " + reqExt);
	}
	else
	{
		DE_ASSERT(format == GL_DEPTH32F_STENCIL8 || format == GL_DEPTH24_STENCIL8);
	}
}